

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_brusselator1D_manyvec.c
# Opt level: O1

int JacVI(N_Vector v,N_Vector Jv,sunrealtype t,N_Vector y,N_Vector fy,void *user_data,N_Vector tmp1)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  long lVar5;
  undefined8 uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  undefined8 *puVar13;
  undefined8 *puVar14;
  undefined8 *puVar15;
  long lVar16;
  
  lVar5 = *user_data;
  dVar1 = *(double *)((long)user_data + 0x38);
  uVar6 = N_VGetSubvector_ManyVector(y,0);
  lVar7 = N_VGetArrayPointer(uVar6);
  if (lVar7 == 0) {
    JacVI_cold_9();
  }
  else {
    uVar6 = N_VGetSubvector_ManyVector(y,1);
    lVar8 = N_VGetArrayPointer(uVar6);
    if (lVar8 == 0) {
      JacVI_cold_8();
    }
    else {
      uVar6 = N_VGetSubvector_ManyVector(y,2);
      lVar9 = N_VGetArrayPointer(uVar6);
      if (lVar9 == 0) {
        JacVI_cold_7();
      }
      else {
        uVar6 = N_VGetSubvector_ManyVector(v,0);
        lVar10 = N_VGetArrayPointer(uVar6);
        if (lVar10 == 0) {
          JacVI_cold_6();
        }
        else {
          uVar6 = N_VGetSubvector_ManyVector(v,1);
          lVar11 = N_VGetArrayPointer(uVar6);
          if (lVar11 == 0) {
            JacVI_cold_5();
          }
          else {
            uVar6 = N_VGetSubvector_ManyVector(v,2);
            lVar12 = N_VGetArrayPointer(uVar6);
            if (lVar12 == 0) {
              JacVI_cold_4();
            }
            else {
              uVar6 = N_VGetSubvector_ManyVector(Jv,0);
              puVar13 = (undefined8 *)N_VGetArrayPointer(uVar6);
              if (puVar13 == (undefined8 *)0x0) {
                JacVI_cold_3();
              }
              else {
                uVar6 = N_VGetSubvector_ManyVector(Jv,1);
                puVar14 = (undefined8 *)N_VGetArrayPointer(uVar6);
                if (puVar14 == (undefined8 *)0x0) {
                  JacVI_cold_2();
                }
                else {
                  uVar6 = N_VGetSubvector_ManyVector(Jv,2);
                  puVar15 = (undefined8 *)N_VGetArrayPointer(uVar6);
                  if (puVar15 != (undefined8 *)0x0) {
                    N_VConst(0,Jv);
                    if (2 < lVar5) {
                      lVar16 = 2;
                      do {
                        dVar2 = *(double *)(lVar7 + -8 + lVar16 * 8);
                        dVar3 = *(double *)(lVar10 + -8 + lVar16 * 8);
                        dVar4 = *(double *)(lVar8 + -8 + lVar16 * 8);
                        puVar13[lVar16 + -1] =
                             (dVar4 + dVar4) * dVar2 * dVar3 +
                             *(double *)(lVar11 + -8 + lVar16 * 8) * dVar2 * dVar2 +
                             ((-*(double *)(lVar12 + -8 + lVar16 * 8) * dVar2 -
                              *(double *)(lVar9 + -8 + lVar16 * 8) * dVar3) - dVar3);
                        dVar2 = *(double *)(lVar7 + -8 + lVar16 * 8);
                        dVar3 = *(double *)(lVar10 + -8 + lVar16 * 8);
                        puVar14[lVar16 + -1] =
                             *(double *)(lVar8 + -8 + lVar16 * 8) * -2.0 * dVar2 * dVar3 +
                             ((*(double *)(lVar12 + -8 + lVar16 * 8) * dVar2 +
                              *(double *)(lVar9 + -8 + lVar16 * 8) * dVar3) -
                             *(double *)(lVar11 + -8 + lVar16 * 8) * dVar2 * dVar2);
                        dVar2 = *(double *)(lVar12 + -8 + lVar16 * 8);
                        puVar15[lVar16 + -1] =
                             (-dVar2 * *(double *)(lVar7 + -8 + lVar16 * 8) - dVar2 / dVar1) -
                             *(double *)(lVar9 + -8 + lVar16 * 8) *
                             *(double *)(lVar10 + -8 + lVar16 * 8);
                        lVar16 = lVar16 + 1;
                      } while (lVar5 != lVar16);
                    }
                    *puVar15 = 0;
                    *puVar14 = 0;
                    *puVar13 = 0;
                    puVar15[lVar5 + -1] = 0;
                    puVar14[lVar5 + -1] = 0;
                    puVar13[lVar5 + -1] = 0;
                    return 0;
                  }
                  JacVI_cold_1();
                }
              }
            }
          }
        }
      }
    }
  }
  return 1;
}

Assistant:

static int JacVI(N_Vector v, N_Vector Jv, sunrealtype t, N_Vector y,
                 N_Vector fy, void* user_data, N_Vector tmp1)
{
  UserData userdata = (UserData)user_data; /* access problem data */
  sunindextype N    = userdata->N;         /* set variable shortcuts */
  sunrealtype ep    = userdata->ep;
  sunrealtype *y_u = NULL, *y_v = NULL, *y_w = NULL;
  sunrealtype *v_u = NULL, *v_v = NULL, *v_w = NULL;
  sunrealtype *Ju_v = NULL, *Jv_v = NULL, *Jw_v = NULL;
  sunindextype i;

  y_u = N_VGetArrayPointer(N_VGetSubvector_ManyVector(y, 0));
  if (check_flag((void*)y_u, "N_VGetArrayPointer", 0)) { return 1; }
  y_v = N_VGetArrayPointer(N_VGetSubvector_ManyVector(y, 1));
  if (check_flag((void*)y_v, "N_VGetArrayPointer", 0)) { return 1; }
  y_w = N_VGetArrayPointer(N_VGetSubvector_ManyVector(y, 2));
  if (check_flag((void*)y_w, "N_VGetArrayPointer", 0)) { return 1; }

  v_u = N_VGetArrayPointer(N_VGetSubvector_ManyVector(v, 0));
  if (check_flag((void*)v_u, "N_VGetArrayPointer", 0)) { return 1; }
  v_v = N_VGetArrayPointer(N_VGetSubvector_ManyVector(v, 1));
  if (check_flag((void*)v_v, "N_VGetArrayPointer", 0)) { return 1; }
  v_w = N_VGetArrayPointer(N_VGetSubvector_ManyVector(v, 2));
  if (check_flag((void*)v_w, "N_VGetArrayPointer", 0)) { return 1; }

  Ju_v = N_VGetArrayPointer(N_VGetSubvector_ManyVector(Jv, 0));
  if (check_flag((void*)Ju_v, "N_VGetArrayPointer", 0)) { return 1; }
  Jv_v = N_VGetArrayPointer(N_VGetSubvector_ManyVector(Jv, 1));
  if (check_flag((void*)Jv_v, "N_VGetArrayPointer", 0)) { return 1; }
  Jw_v = N_VGetArrayPointer(N_VGetSubvector_ManyVector(Jv, 2));
  if (check_flag((void*)Jw_v, "N_VGetArrayPointer", 0)) { return 1; }

  N_VConst(ZERO, Jv); /* initialize Jv to zero */

  /* iterate over domain, computing Jacobian-vector products */
  for (i = 1; i < N - 1; i++)
  {
    /* Fill in Jacobian-vector product for Ju*v */
    Ju_v[i] = -v_w[i] * y_u[i] - y_w[i] * v_u[i] - v_u[i] +
              v_v[i] * y_u[i] * y_u[i] + TWO * y_v[i] * y_u[i] * v_u[i];

    /* Fill in Jacobian-vector product for Jv*v */
    Jv_v[i] = v_w[i] * y_u[i] + y_w[i] * v_u[i] - v_v[i] * y_u[i] * y_u[i] -
              TWO * y_v[i] * y_u[i] * v_u[i];

    /* Fill in Jacobian-vector product for Jw*v */
    Jw_v[i] = -v_w[i] / ep - v_w[i] * y_u[i] - y_w[i] * v_u[i];
  }

  /* enforce stationary boundaries */
  Ju_v[0] = Jv_v[0] = Jw_v[0] = ZERO;
  Ju_v[N - 1] = Jv_v[N - 1] = Jw_v[N - 1] = ZERO;

  return 0; /* Return with success */
}